

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_test.cpp
# Opt level: O0

void __thiscall
jhu::thrax::LabelTests_SAMTConcatComma_Test::TestBody(LabelTests_SAMTConcatComma_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_f8;
  Message local_f0;
  undefined2 local_e8;
  undefined2 uStack_e6;
  undefined2 uStack_e4;
  undefined2 uStack_e2;
  string_view local_e0;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar;
  vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_> local_b0;
  undefined1 local_98 [8];
  SAMTLabeler sl;
  undefined1 local_28 [8];
  Tree t;
  LabelTests_SAMTConcatComma_Test *this_local;
  
  t.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)&sl.key_.label.field_2 + 8),
             "(ROOT baz (, foo) (B bar))");
  readTree((Tree *)local_28,stack0xffffffffffffffc8);
  std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>::vector
            (&local_b0,(Tree *)local_28);
  SAMTLabeler::SAMTLabeler((SAMTLabeler *)local_98,&local_b0);
  std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>::~vector(&local_b0);
  local_e8 = 0;
  uStack_e6 = 0;
  uStack_e4 = 1;
  uStack_e2 = 3;
  local_e0 = SAMTLabeler::operator()((SAMTLabeler *)local_98,(SpanPair)0x3000100000000);
  testing::internal::EqHelper<false>::
  Compare<char[8],std::basic_string_view<char,std::char_traits<char>>>
            ((EqHelper<false> *)local_d0,"\"COMMA+B\"","sl(SpanPair{{}, { 1, 3 }})",
             (char (*) [8])"COMMA+B",&local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/label_test.cpp"
               ,0x88,message);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  SAMTLabeler::~SAMTLabeler((SAMTLabeler *)local_98);
  std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>::~vector
            ((vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_> *)local_28);
  return;
}

Assistant:

TEST(LabelTests, SAMTConcatComma) {
  auto t = readTree("(ROOT baz (, foo) (B bar))");
  SAMTLabeler sl(std::move(t));
  EXPECT_EQ("COMMA+B", sl(SpanPair{{}, { 1, 3 }}));
}